

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall
re2::Compiler::CachedRuneByteSuffix(Compiler *this,uint8 lo,uint8 hi,bool foldcase,int next)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  iterator iStack_48;
  int id;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_int>_> local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_int>_> local_30;
  const_iterator it;
  uint64 key;
  int next_local;
  bool foldcase_local;
  uint8 hi_local;
  uint8 lo_local;
  Compiler *this_local;
  
  it._M_node = (_Base_ptr)MakeRuneCacheKey(lo,hi,foldcase,next);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
       ::find(&this->rune_cache_,(key_type *)&it);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_int>_>::_Rb_tree_const_iterator
            (&local_30,&local_38);
  iStack_48 = std::
              map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
              ::end(&this->rune_cache_);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_int>_>::_Rb_tree_const_iterator
            (&local_40,&stack0xffffffffffffffb8);
  bVar1 = std::operator!=(&local_30,&local_40);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_int>_>::operator->
                       (&local_30);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this_local._4_4_ = UncachedRuneByteSuffix(this,lo,hi,foldcase,next);
    pmVar3 = std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::operator[](&this->rune_cache_,(key_type *)&it);
    *pmVar3 = this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int Compiler::CachedRuneByteSuffix(uint8 lo, uint8 hi, bool foldcase,
                                   int next) {
  uint64 key = MakeRuneCacheKey(lo, hi, foldcase, next);
  map<uint64, int>::const_iterator it = rune_cache_.find(key);
  if (it != rune_cache_.end())
    return it->second;
  int id = UncachedRuneByteSuffix(lo, hi, foldcase, next);
  rune_cache_[key] = id;
  return id;
}